

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int writeRandomBytes_getrandom_nonblock(void *target,size_t count)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int bytesWrittenMore;
  size_t bytesToWrite;
  void *currentTarget;
  ulong uStack_28;
  uint getrandomFlags;
  size_t bytesWrittenTotal;
  int success;
  size_t count_local;
  void *target_local;
  
  bytesWrittenTotal._4_4_ = 0;
  uStack_28 = 0;
  do {
    iVar1 = getrandom((long)target + uStack_28,count - uStack_28,1);
    if ((0 < iVar1) && (uStack_28 = (long)iVar1 + uStack_28, count <= uStack_28)) {
      bytesWrittenTotal._4_4_ = 1;
    }
    bVar3 = false;
    if (bytesWrittenTotal._4_4_ == 0) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return bytesWrittenTotal._4_4_;
}

Assistant:

static int
writeRandomBytes_getrandom_nonblock(void *target, size_t count) {
  int success = 0; /* full count bytes written? */
  size_t bytesWrittenTotal = 0;
  const unsigned int getrandomFlags = GRND_NONBLOCK;

  do {
    void *const currentTarget = (void *)((char *)target + bytesWrittenTotal);
    const size_t bytesToWrite = count - bytesWrittenTotal;

    const int bytesWrittenMore =
#    if defined(HAVE_GETRANDOM)
        getrandom(currentTarget, bytesToWrite, getrandomFlags);
#    else
        syscall(SYS_getrandom, currentTarget, bytesToWrite, getrandomFlags);
#    endif

    if (bytesWrittenMore > 0) {
      bytesWrittenTotal += bytesWrittenMore;
      if (bytesWrittenTotal >= count)
        success = 1;
    }
  } while (! success && (errno == EINTR));

  return success;
}